

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O1

int16_t aom_rb_read_signed_primitive_refsubexpfin
                  (aom_read_bit_buffer *rb,uint16_t n,uint16_t k,int16_t ref)

{
  int iVar1;
  bool bVar2;
  ushort uVar3;
  short sVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined6 in_register_00000012;
  int iVar8;
  uint uVar9;
  ulong unaff_RBP;
  short sVar10;
  uint uVar11;
  int mk;
  int iVar12;
  int i;
  int iVar13;
  
  iVar1 = (int)CONCAT62(in_register_00000012,k);
  uVar11 = (uint)(ushort)(n * 2 - 1);
  iVar12 = 0;
  iVar13 = 0;
  do {
    iVar8 = iVar1 + -1 + iVar13;
    if (iVar13 == 0) {
      iVar8 = iVar1;
    }
    if ((3 << ((byte)iVar8 & 0x1f)) + iVar12 < (int)uVar11) {
      iVar5 = aom_rb_read_bit(rb);
      if (iVar5 == 0) {
        if (iVar8 < 1) {
          uVar9 = 0;
        }
        else {
          iVar8 = iVar13 + (uint)(iVar13 == 0) + iVar1;
          uVar9 = 0;
          do {
            iVar5 = aom_rb_read_bit(rb);
            uVar9 = uVar9 | iVar5 << ((char)iVar8 - 2U & 0x1f);
            iVar8 = iVar8 + -1;
          } while (1 < iVar8);
        }
        unaff_RBP = (ulong)(uVar9 + iVar12);
        bVar2 = false;
      }
      else {
        iVar13 = iVar13 + 1;
        iVar12 = iVar12 + (1 << ((byte)iVar8 & 0x1f));
        bVar2 = true;
      }
    }
    else {
      uVar9 = 0;
      if (1 < (ushort)(uVar11 - iVar12)) {
        uVar6 = uVar11 - iVar12 & 0xffff;
        iVar8 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        if (iVar8 != 0) {
          iVar5 = iVar8 + 1;
          uVar9 = 0;
          do {
            iVar7 = aom_rb_read_bit(rb);
            uVar9 = uVar9 | iVar7 << ((char)iVar5 - 2U & 0x1f);
            iVar5 = iVar5 + -1;
          } while (1 < iVar5);
        }
        iVar8 = (2 << ((byte)iVar8 & 0x1f)) - uVar6;
        if (iVar8 <= (int)uVar9) {
          iVar5 = aom_rb_read_bit(rb);
          uVar9 = (uVar9 * 2 - iVar8) + iVar5;
        }
      }
      unaff_RBP = (ulong)(uVar9 + iVar12);
      bVar2 = false;
    }
    sVar4 = (short)unaff_RBP;
  } while (bVar2);
  uVar3 = (n - 1) + ref;
  if (uVar11 < (uint)uVar3 * 2) {
    sVar10 = n * 2 + -2;
    uVar3 = sVar10 - uVar3;
    uVar11 = (uint)(unaff_RBP & 0xffff);
    if (uVar11 <= (uint)uVar3 * 2) {
      if ((unaff_RBP & 1) == 0) {
        sVar4 = (short)((unaff_RBP & 0xffff) >> 1);
      }
      else {
        sVar4 = -(short)(uVar11 + 1 >> 1);
      }
      sVar4 = uVar3 + sVar4;
    }
    sVar4 = sVar10 - sVar4;
  }
  else {
    uVar11 = (uint)(unaff_RBP & 0xffff);
    if (uVar11 <= (uint)uVar3 * 2) {
      if ((unaff_RBP & 1) == 0) {
        sVar4 = (short)((unaff_RBP & 0xffff) >> 1);
      }
      else {
        sVar4 = -(short)(uVar11 + 1 >> 1);
      }
      sVar4 = uVar3 + sVar4;
    }
  }
  return (sVar4 - n) + 1;
}

Assistant:

int16_t aom_rb_read_signed_primitive_refsubexpfin(
    struct aom_read_bit_buffer *rb, uint16_t n, uint16_t k, int16_t ref) {
  ref += n - 1;
  const uint16_t scaled_n = (n << 1) - 1;
  return aom_rb_read_primitive_refsubexpfin(rb, scaled_n, k, ref) - n + 1;
}